

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O0

int counted_loc_descr(Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Small *enddata,Dwarf_Unsigned offset,
                     Dwarf_Unsigned *loc_ops_overall_size,Dwarf_Unsigned *loc_ops_count_len,
                     Dwarf_Unsigned *loc_ops_len,Dwarf_Small **opsdata,Dwarf_Unsigned *opsoffset,
                     Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned DStack_60;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned leblen;
  Dwarf_Unsigned ops_len;
  Dwarf_Unsigned *loc_ops_count_len_local;
  Dwarf_Unsigned *loc_ops_overall_size_local;
  Dwarf_Unsigned offset_local;
  Dwarf_Small *enddata_local;
  Dwarf_Small *data_local;
  Dwarf_Debug dbg_local;
  
  leblen = 0;
  lu_leblen = 0;
  lu_local = 0;
  DStack_60 = 0;
  ops_len = (Dwarf_Unsigned)loc_ops_count_len;
  loc_ops_count_len_local = loc_ops_overall_size;
  loc_ops_overall_size_local = (Dwarf_Unsigned *)offset;
  offset_local = (Dwarf_Unsigned)enddata;
  enddata_local = data;
  data_local = (Dwarf_Small *)dbg;
  iVar1 = dwarf_decode_leb128((char *)data,&lu_local,&stack0xffffffffffffffa0,(char *)enddata);
  if (iVar1 != 1) {
    *(Dwarf_Unsigned *)ops_len = lu_local;
    *loc_ops_count_len_local = DStack_60 + lu_local;
    *loc_ops_len = DStack_60;
    *opsdata = enddata_local + lu_local;
    *opsoffset = (long)loc_ops_overall_size_local + lu_local;
  }
  else {
    _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                        "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
  }
  dbg_local._4_4_ = (uint)(iVar1 == 1);
  return dbg_local._4_4_;
}

Assistant:

static int
counted_loc_descr(Dwarf_Debug dbg,
    Dwarf_Small *data,
    Dwarf_Small *enddata,
    Dwarf_Unsigned offset,
    Dwarf_Unsigned *loc_ops_overall_size,
    Dwarf_Unsigned *loc_ops_count_len,
    Dwarf_Unsigned *loc_ops_len,
    Dwarf_Small    **opsdata,
    Dwarf_Unsigned *opsoffset,
    Dwarf_Error *  error)
{
    Dwarf_Unsigned ops_len = 0;
    Dwarf_Unsigned leblen = 0;
    DECODE_LEB128_UWORD_LEN_CK(data,ops_len,leblen,
        dbg,error,enddata);
    *loc_ops_count_len = leblen;
    *loc_ops_overall_size = ops_len+leblen;
    *loc_ops_len = ops_len;
    *opsdata = data;
    *opsoffset = offset +leblen;
    return DW_DLV_OK;
}